

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O0

void __thiscall
CVmObjIterIdx::CVmObjIterIdx
          (CVmObjIterIdx *this,vm_val_t *coll,long first_valid_index,long last_valid_index)

{
  CVmVarHeap *pCVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  CVmObjIterIdx *in_RCX;
  vm_val_t *in_RDI;
  undefined4 extraout_var;
  
  CVmObjIter::CVmObjIter(&in_RCX->super_CVmObjIter);
  *(undefined ***)in_RDI = &PTR_get_metaclass_reg_003e6838;
  pCVar1 = CVmMemory::get_var_heap(G_mem_X);
  aVar2._0_4_ = (*pCVar1->_vptr_CVmVarHeap[4])(pCVar1,0x15,in_RDI);
  aVar2._4_4_ = extraout_var;
  in_RDI->val = aVar2;
  vmb_put_dh((char *)in_RCX,in_RDI);
  set_cur_index_no_undo(in_RCX,(long)in_RDI);
  set_first_valid(in_RCX,(long)in_RDI);
  set_last_valid(in_RCX,(long)in_RDI);
  set_flags(in_RCX,(unsigned_long)in_RDI);
  return;
}

Assistant:

CVmObjIterIdx::CVmObjIterIdx(VMG_ const vm_val_t *coll,
                             long first_valid_index, long last_valid_index)
{
    /* allocate space for our extension data */
    ext_ = (char *)G_mem->get_var_heap()
           ->alloc_mem(VMOBJITERIDX_EXT_SIZE, this);

    /* save the collection value */
    vmb_put_dh(ext_, coll);

    /* 
     *   set the current index to the first index minus 1, so that we start
     *   with the first element when we make our first call to getNext() 
     */
    set_cur_index_no_undo(first_valid_index - 1);

    /* remember the first and last valid index values */
    set_first_valid(first_valid_index);
    set_last_valid(last_valid_index);

    /* clear the flags */
    set_flags(0);
}